

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

void __thiscall spvtools::opt::ConstantFoldingRules::AddFoldingRules(ConstantFoldingRules *this)

{
  mapped_type *pmVar1;
  _func_uint64_t_uint64_t_uint64_t *p_Var2;
  mapped_type *pmVar3;
  BinaryScalarFoldingRule local_1020;
  ConstantFoldingRule local_1000;
  key_type local_fe0;
  BinaryScalarFoldingRule local_fd8;
  ConstantFoldingRule local_fb8;
  key_type local_f98;
  UnaryScalarFoldingRule local_f90;
  ConstantFoldingRule local_f70;
  key_type local_f50;
  UnaryScalarFoldingRule local_f48;
  ConstantFoldingRule local_f28;
  key_type local_f08;
  UnaryScalarFoldingRule local_f00;
  ConstantFoldingRule local_ee0;
  key_type local_ec0;
  UnaryScalarFoldingRule local_eb8;
  ConstantFoldingRule local_e98;
  key_type local_e78;
  UnaryScalarFoldingRule local_e70;
  ConstantFoldingRule local_e50;
  key_type local_e30;
  UnaryScalarFoldingRule local_e28;
  ConstantFoldingRule local_e08;
  key_type local_de8;
  UnaryScalarFoldingRule local_de0;
  ConstantFoldingRule local_dc0;
  key_type local_da0;
  UnaryScalarFoldingRule local_d98;
  ConstantFoldingRule local_d78;
  key_type local_d58;
  UnaryScalarFoldingRule local_d50;
  ConstantFoldingRule local_d30;
  key_type local_d10;
  UnaryScalarFoldingRule local_d08;
  ConstantFoldingRule local_ce8;
  key_type local_cc8;
  UnaryScalarFoldingRule local_cc0;
  ConstantFoldingRule local_ca0;
  key_type local_c80;
  ConstantFoldingRule local_c78;
  key_type local_c58;
  ConstantFoldingRule local_c50;
  key_type local_c30;
  ConstantFoldingRule local_c28;
  key_type local_c08;
  ConstantFoldingRule local_c00;
  key_type local_be0;
  ConstantFoldingRule local_bd8;
  key_type local_bb8;
  ConstantFoldingRule local_bb0;
  key_type local_b90;
  ConstantFoldingRule local_b88;
  key_type local_b68;
  ConstantFoldingRule local_b60;
  key_type local_b40;
  ConstantFoldingRule local_b38;
  key_type local_b18;
  BinaryScalarFoldingRule local_b10;
  ConstantFoldingRule local_af0;
  key_type local_ad0;
  BinaryScalarFoldingRule local_ac8;
  ConstantFoldingRule local_aa8;
  key_type local_a88;
  BinaryScalarFoldingRule local_a80;
  ConstantFoldingRule local_a60;
  key_type local_a40;
  BinaryScalarFoldingRule local_a38;
  ConstantFoldingRule local_a18;
  key_type local_9f8;
  BinaryScalarFoldingRule local_9f0;
  ConstantFoldingRule local_9d0;
  key_type local_9b0;
  BinaryScalarFoldingRule local_9a8;
  ConstantFoldingRule local_988;
  key_type local_968;
  ConstantFoldingRule local_960;
  key_type local_93c;
  uint32_t local_934;
  FeatureManager *pFStack_930;
  uint32_t ext_inst_glslstd450_id;
  FeatureManager *feature_manager;
  BinaryScalarFoldingRule local_920;
  ConstantFoldingRule local_900;
  key_type local_8e0;
  __6 local_8d9;
  BinaryScalarFoldingRule local_8d8;
  ConstantFoldingRule local_8b8;
  key_type local_898;
  __5 local_891;
  BinaryScalarFoldingRule local_890;
  ConstantFoldingRule local_870;
  key_type local_850;
  __4 local_849;
  BinaryScalarFoldingRule local_848;
  ConstantFoldingRule local_828;
  key_type local_808;
  __3 local_801;
  BinaryScalarFoldingRule local_800;
  ConstantFoldingRule local_7e0;
  key_type local_7c0;
  __2 local_7b9;
  BinaryScalarFoldingRule local_7b8;
  ConstantFoldingRule local_798;
  key_type local_778;
  __1 local_771;
  BinaryScalarFoldingRule local_770;
  ConstantFoldingRule local_750;
  key_type local_730;
  __0 local_729;
  BinaryScalarFoldingRule local_728;
  ConstantFoldingRule local_708;
  key_type local_6e4;
  ConstantFoldingRule local_6e0;
  key_type local_6bc;
  ConstantFoldingRule local_6b8;
  key_type local_694;
  ConstantFoldingRule local_690;
  key_type local_66c;
  ConstantFoldingRule local_668;
  key_type local_644;
  ConstantFoldingRule local_640;
  key_type local_61c;
  ConstantFoldingRule local_618;
  key_type local_5f4;
  ConstantFoldingRule local_5f0;
  key_type local_5cc;
  ConstantFoldingRule local_5c8;
  key_type local_5a4;
  ConstantFoldingRule local_5a0;
  key_type local_57c;
  ConstantFoldingRule local_578;
  key_type local_554;
  ConstantFoldingRule local_550;
  key_type local_52c;
  ConstantFoldingRule local_528;
  key_type local_504;
  ConstantFoldingRule local_500;
  key_type local_4dc;
  ConstantFoldingRule local_4d8;
  key_type local_4b4;
  ConstantFoldingRule local_4b0;
  key_type local_48c;
  ConstantFoldingRule local_488;
  key_type local_464;
  ConstantFoldingRule local_460;
  key_type local_43c;
  ConstantFoldingRule local_438;
  key_type local_414;
  ConstantFoldingRule local_410;
  key_type local_3ec;
  ConstantFoldingRule local_3e8;
  key_type local_3c4;
  ConstantFoldingRule local_3c0;
  key_type local_39c;
  ConstantFoldingRule local_398;
  key_type local_374;
  ConstantFoldingRule local_370;
  key_type local_34c;
  ConstantFoldingRule local_348;
  key_type local_324;
  ConstantFoldingRule local_320;
  key_type local_2fc;
  ConstantFoldingRule local_2f8;
  key_type local_2d4;
  ConstantFoldingRule local_2d0;
  key_type local_2ac;
  ConstantFoldingRule local_2a8;
  key_type local_284;
  ConstantFoldingRule local_280;
  key_type local_25c;
  ConstantFoldingRule local_258;
  key_type local_234;
  ConstantFoldingRule local_230;
  key_type local_20c;
  ConstantFoldingRule local_208;
  key_type local_1e4;
  ConstantFoldingRule local_1e0;
  key_type local_1bc;
  UnaryScalarFoldingRule local_1b8;
  ConstantFoldingRule local_198;
  key_type local_174;
  UnaryScalarFoldingRule local_170;
  ConstantFoldingRule local_150;
  key_type local_12c;
  ConstantFoldingRule local_128;
  key_type local_104;
  ConstantFoldingRule local_100;
  key_type local_dc;
  ConstantFoldingRule local_d8;
  key_type local_b4;
  ConstantFoldingRule local_b0;
  key_type local_8c;
  ConstantFoldingRule local_88;
  key_type local_64;
  ConstantFoldingRule local_60;
  key_type local_3c;
  ConstantFoldingRule local_38;
  key_type local_14;
  ConstantFoldingRules *local_10;
  ConstantFoldingRules *this_local;
  
  local_14 = OpCompositeConstruct;
  local_10 = this;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_14);
  anon_unknown_0::FoldCompositeWithConstants();
  Value::push_back(pmVar1,&local_38);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_38);
  local_3c = OpCompositeExtract;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_3c);
  anon_unknown_0::FoldExtractWithConstants();
  Value::push_back(pmVar1,&local_60);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_60);
  local_64 = OpCompositeInsert;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_64);
  anon_unknown_0::FoldInsertWithConstants();
  Value::push_back(pmVar1,&local_88);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_88);
  local_8c = OpConvertFToS;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_8c);
  anon_unknown_0::FoldFToI();
  Value::push_back(pmVar1,&local_b0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_b0);
  local_b4 = OpConvertFToU;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_b4);
  anon_unknown_0::FoldFToI();
  Value::push_back(pmVar1,&local_d8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_d8);
  local_dc = OpConvertSToF;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_dc);
  anon_unknown_0::FoldIToF();
  Value::push_back(pmVar1,&local_100);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_100);
  local_104 = OpConvertUToF;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_104);
  anon_unknown_0::FoldIToF();
  Value::push_back(pmVar1,&local_128);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_128);
  local_12c = OpSConvert;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_12c);
  std::
  function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
  ::
  function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
            ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
              *)&local_170,anon_unknown_0::FoldScalarSConvert);
  anon_unknown_0::FoldUnaryOp(&local_150,&local_170);
  Value::push_back(pmVar1,&local_150);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_150);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_170);
  local_174 = OpUConvert;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_174);
  std::
  function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
  ::
  function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
            ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
              *)&local_1b8,anon_unknown_0::FoldScalarUConvert);
  anon_unknown_0::FoldUnaryOp(&local_198,&local_1b8);
  Value::push_back(pmVar1,&local_198);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_198);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_1b8);
  local_1bc = OpDot;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_1bc);
  anon_unknown_0::FoldOpDotWithConstants();
  Value::push_back(pmVar1,&local_1e0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_1e0);
  local_1e4 = OpFAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_1e4);
  anon_unknown_0::FoldFAdd();
  Value::push_back(pmVar1,&local_208);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_208);
  local_20c = OpFDiv;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_20c);
  anon_unknown_0::FoldFDiv();
  Value::push_back(pmVar1,&local_230);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_230);
  local_234 = OpFMul;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_234);
  anon_unknown_0::FoldFMul();
  Value::push_back(pmVar1,&local_258);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_258);
  local_25c = OpFSub;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_25c);
  anon_unknown_0::FoldFSub();
  Value::push_back(pmVar1,&local_280);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_280);
  local_284 = OpFOrdEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_284);
  anon_unknown_0::FoldFOrdEqual();
  Value::push_back(pmVar1,&local_2a8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_2a8);
  local_2ac = OpFUnordEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_2ac);
  anon_unknown_0::FoldFUnordEqual();
  Value::push_back(pmVar1,&local_2d0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_2d0);
  local_2d4 = OpFOrdNotEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_2d4);
  anon_unknown_0::FoldFOrdNotEqual();
  Value::push_back(pmVar1,&local_2f8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_2f8);
  local_2fc = OpFUnordNotEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_2fc);
  anon_unknown_0::FoldFUnordNotEqual();
  Value::push_back(pmVar1,&local_320);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_320);
  local_324 = OpFOrdLessThan;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_324);
  anon_unknown_0::FoldFOrdLessThan();
  Value::push_back(pmVar1,&local_348);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_348);
  local_34c = OpFOrdLessThan;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_34c);
  anon_unknown_0::FoldFClampFeedingCompare(&local_370,OpFOrdLessThan);
  Value::push_back(pmVar1,&local_370);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_370);
  local_374 = OpFUnordLessThan;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_374);
  anon_unknown_0::FoldFUnordLessThan();
  Value::push_back(pmVar1,&local_398);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_398);
  local_39c = OpFUnordLessThan;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_39c);
  anon_unknown_0::FoldFClampFeedingCompare(&local_3c0,OpFUnordLessThan);
  Value::push_back(pmVar1,&local_3c0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_3c0);
  local_3c4 = OpFOrdGreaterThan;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_3c4);
  anon_unknown_0::FoldFOrdGreaterThan();
  Value::push_back(pmVar1,&local_3e8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_3e8);
  local_3ec = OpFOrdGreaterThan;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_3ec);
  anon_unknown_0::FoldFClampFeedingCompare(&local_410,OpFOrdGreaterThan);
  Value::push_back(pmVar1,&local_410);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_410);
  local_414 = OpFUnordGreaterThan;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_414);
  anon_unknown_0::FoldFUnordGreaterThan();
  Value::push_back(pmVar1,&local_438);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_438);
  local_43c = OpFUnordGreaterThan;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_43c);
  anon_unknown_0::FoldFClampFeedingCompare(&local_460,OpFUnordGreaterThan);
  Value::push_back(pmVar1,&local_460);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_460);
  local_464 = OpFOrdLessThanEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_464);
  anon_unknown_0::FoldFOrdLessThanEqual();
  Value::push_back(pmVar1,&local_488);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_488);
  local_48c = OpFOrdLessThanEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_48c);
  anon_unknown_0::FoldFClampFeedingCompare(&local_4b0,OpFOrdLessThanEqual);
  Value::push_back(pmVar1,&local_4b0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_4b0);
  local_4b4 = OpFUnordLessThanEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_4b4);
  anon_unknown_0::FoldFUnordLessThanEqual();
  Value::push_back(pmVar1,&local_4d8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_4d8);
  local_4dc = OpFUnordLessThanEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_4dc);
  anon_unknown_0::FoldFClampFeedingCompare(&local_500,OpFUnordLessThanEqual);
  Value::push_back(pmVar1,&local_500);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_500);
  local_504 = OpFOrdGreaterThanEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_504);
  anon_unknown_0::FoldFOrdGreaterThanEqual();
  Value::push_back(pmVar1,&local_528);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_528);
  local_52c = OpFOrdGreaterThanEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_52c);
  anon_unknown_0::FoldFClampFeedingCompare(&local_550,OpFOrdGreaterThanEqual);
  Value::push_back(pmVar1,&local_550);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_550);
  local_554 = OpFUnordGreaterThanEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_554);
  anon_unknown_0::FoldFUnordGreaterThanEqual();
  Value::push_back(pmVar1,&local_578);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_578);
  local_57c = OpFUnordGreaterThanEqual;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_57c);
  anon_unknown_0::FoldFClampFeedingCompare(&local_5a0,OpFUnordGreaterThanEqual);
  Value::push_back(pmVar1,&local_5a0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_5a0);
  local_5a4 = OpVectorShuffle;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_5a4);
  anon_unknown_0::FoldVectorShuffleWithConstants();
  Value::push_back(pmVar1,&local_5c8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_5c8);
  local_5cc = OpVectorTimesScalar;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_5cc);
  anon_unknown_0::FoldVectorTimesScalar();
  Value::push_back(pmVar1,&local_5f0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_5f0);
  local_5f4 = OpVectorTimesMatrix;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_5f4);
  anon_unknown_0::FoldVectorTimesMatrix();
  Value::push_back(pmVar1,&local_618);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_618);
  local_61c = OpMatrixTimesVector;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_61c);
  anon_unknown_0::FoldMatrixTimesVector();
  Value::push_back(pmVar1,&local_640);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_640);
  local_644 = OpTranspose;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_644);
  std::
  function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
  ::
  function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
            ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
              *)&local_668,anon_unknown_0::FoldTranspose);
  Value::push_back(pmVar1,&local_668);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_668);
  local_66c = OpFNegate;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_66c);
  anon_unknown_0::FoldFNegate();
  Value::push_back(pmVar1,&local_690);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_690);
  local_694 = OpSNegate;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_694);
  anon_unknown_0::FoldSNegate();
  Value::push_back(pmVar1,&local_6b8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_6b8);
  local_6bc = OpQuantizeToF16;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_6bc);
  anon_unknown_0::FoldQuantizeToF16();
  Value::push_back(pmVar1,&local_6e0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_6e0);
  local_6e4 = OpIAdd;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_6e4);
  p_Var2 = AddFoldingRules()::$_0::operator_cast_to_function_pointer(&local_729);
  anon_unknown_0::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)1>
            (&local_728,p_Var2);
  anon_unknown_0::FoldBinaryOp(&local_708,&local_728);
  Value::push_back(pmVar1,&local_708);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_708);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_728);
  local_730 = OpISub;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_730);
  p_Var2 = AddFoldingRules()::$_1::operator_cast_to_function_pointer(&local_771);
  anon_unknown_0::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)1>
            (&local_770,p_Var2);
  anon_unknown_0::FoldBinaryOp(&local_750,&local_770);
  Value::push_back(pmVar1,&local_750);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_750);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_770);
  local_778 = OpIMul;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_778);
  p_Var2 = AddFoldingRules()::$_2::operator_cast_to_function_pointer(&local_7b9);
  anon_unknown_0::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)1>
            (&local_7b8,p_Var2);
  anon_unknown_0::FoldBinaryOp(&local_798,&local_7b8);
  Value::push_back(pmVar1,&local_798);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_798);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_7b8);
  local_7c0 = OpUDiv;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_7c0);
  p_Var2 = AddFoldingRules()::$_3::operator_cast_to_function_pointer(&local_801);
  anon_unknown_0::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)1>
            (&local_800,p_Var2);
  anon_unknown_0::FoldBinaryOp(&local_7e0,&local_800);
  Value::push_back(pmVar1,&local_7e0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_7e0);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_800);
  local_808 = OpSDiv;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_808);
  p_Var2 = AddFoldingRules()::$_4::operator_cast_to_function_pointer(&local_849);
  anon_unknown_0::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)0>
            (&local_848,p_Var2);
  anon_unknown_0::FoldBinaryOp(&local_828,&local_848);
  Value::push_back(pmVar1,&local_828);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_828);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_848);
  local_850 = OpUMod;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_850);
  p_Var2 = AddFoldingRules()::$_5::operator_cast_to_function_pointer(&local_891);
  anon_unknown_0::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)1>
            (&local_890,p_Var2);
  anon_unknown_0::FoldBinaryOp(&local_870,&local_890);
  Value::push_back(pmVar1,&local_870);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_870);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_890);
  local_898 = OpSRem;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_898);
  p_Var2 = AddFoldingRules()::$_6::operator_cast_to_function_pointer(&local_8d9);
  anon_unknown_0::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)0>
            (&local_8d8,p_Var2);
  anon_unknown_0::FoldBinaryOp(&local_8b8,&local_8d8);
  Value::push_back(pmVar1,&local_8b8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_8b8);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_8d8);
  local_8e0 = OpSMod;
  pmVar1 = std::
           unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
           ::operator[](&this->rules_,&local_8e0);
  p_Var2 = AddFoldingRules()::$_7::operator_cast_to_function_pointer
                     ((__7 *)((long)&feature_manager + 7));
  anon_unknown_0::FoldBinaryIntegerOperation<(spvtools::opt::(anonymous_namespace)::Sign)0>
            (&local_920,p_Var2);
  anon_unknown_0::FoldBinaryOp(&local_900,&local_920);
  Value::push_back(pmVar1,&local_900);
  std::
  function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  ::~function(&local_900);
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function(&local_920);
  pFStack_930 = IRContext::get_feature_mgr(this->context_);
  local_93c.instruction_set = FeatureManager::GetExtInstImportId_GLSLstd450(pFStack_930);
  if (local_93c.instruction_set != 0) {
    local_93c.opcode = 0x2e;
    local_934 = local_93c.instruction_set;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_93c);
    anon_unknown_0::FoldFMix();
    Value::push_back(pmVar3,&local_960);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_960);
    local_968.instruction_set = local_934;
    local_968.opcode = 0x27;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_968);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                *)&local_9a8,anon_unknown_0::FoldMin);
    anon_unknown_0::FoldFPBinaryOp(&local_988,&local_9a8);
    Value::push_back(pmVar3,&local_988);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_988);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_9a8);
    local_9b0.instruction_set = local_934;
    local_9b0.opcode = 0x26;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_9b0);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                *)&local_9f0,anon_unknown_0::FoldMin);
    anon_unknown_0::FoldFPBinaryOp(&local_9d0,&local_9f0);
    Value::push_back(pmVar3,&local_9d0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_9d0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_9f0);
    local_9f8.instruction_set = local_934;
    local_9f8.opcode = 0x25;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_9f8);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                *)&local_a38,anon_unknown_0::FoldMin);
    anon_unknown_0::FoldFPBinaryOp(&local_a18,&local_a38);
    Value::push_back(pmVar3,&local_a18);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_a18);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_a38);
    local_a40.instruction_set = local_934;
    local_a40.opcode = 0x2a;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_a40);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                *)&local_a80,anon_unknown_0::FoldMax);
    anon_unknown_0::FoldFPBinaryOp(&local_a60,&local_a80);
    Value::push_back(pmVar3,&local_a60);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_a60);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_a80);
    local_a88.instruction_set = local_934;
    local_a88.opcode = 0x29;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_a88);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                *)&local_ac8,anon_unknown_0::FoldMax);
    anon_unknown_0::FoldFPBinaryOp(&local_aa8,&local_ac8);
    Value::push_back(pmVar3,&local_aa8);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_aa8);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_ac8);
    local_ad0.instruction_set = local_934;
    local_ad0.opcode = 0x28;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_ad0);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                *)&local_b10,anon_unknown_0::FoldMax);
    anon_unknown_0::FoldFPBinaryOp(&local_af0,&local_b10);
    Value::push_back(pmVar3,&local_af0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_af0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_b10);
    local_b18.instruction_set = local_934;
    local_b18.opcode = 0x2c;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_b18);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_b38,anon_unknown_0::FoldClamp1);
    Value::push_back(pmVar3,&local_b38);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_b38);
    local_b40.instruction_set = local_934;
    local_b40.opcode = 0x2c;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_b40);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_b60,anon_unknown_0::FoldClamp2);
    Value::push_back(pmVar3,&local_b60);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_b60);
    local_b68.instruction_set = local_934;
    local_b68.opcode = 0x2c;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_b68);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_b88,anon_unknown_0::FoldClamp3);
    Value::push_back(pmVar3,&local_b88);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_b88);
    local_b90.instruction_set = local_934;
    local_b90.opcode = 0x2d;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_b90);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_bb0,anon_unknown_0::FoldClamp1);
    Value::push_back(pmVar3,&local_bb0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_bb0);
    local_bb8.instruction_set = local_934;
    local_bb8.opcode = 0x2d;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_bb8);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_bd8,anon_unknown_0::FoldClamp2);
    Value::push_back(pmVar3,&local_bd8);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_bd8);
    local_be0.instruction_set = local_934;
    local_be0.opcode = 0x2d;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_be0);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_c00,anon_unknown_0::FoldClamp3);
    Value::push_back(pmVar3,&local_c00);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_c00);
    local_c08.instruction_set = local_934;
    local_c08.opcode = 0x2b;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_c08);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_c28,anon_unknown_0::FoldClamp1);
    Value::push_back(pmVar3,&local_c28);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_c28);
    local_c30.instruction_set = local_934;
    local_c30.opcode = 0x2b;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_c30);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_c50,anon_unknown_0::FoldClamp2);
    Value::push_back(pmVar3,&local_c50);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_c50);
    local_c58.instruction_set = local_934;
    local_c58.opcode = 0x2b;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_c58);
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>
                *)&local_c78,anon_unknown_0::FoldClamp3);
    Value::push_back(pmVar3,&local_c78);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_c78);
    local_c80.instruction_set = local_934;
    local_c80.opcode = 0xd;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_c80);
    anon_unknown_0::FoldFTranscendentalUnary(&local_cc0,sin);
    anon_unknown_0::FoldFPUnaryOp(&local_ca0,&local_cc0);
    Value::push_back(pmVar3,&local_ca0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_ca0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_cc0);
    local_cc8.instruction_set = local_934;
    local_cc8.opcode = 0xe;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_cc8);
    anon_unknown_0::FoldFTranscendentalUnary(&local_d08,cos);
    anon_unknown_0::FoldFPUnaryOp(&local_ce8,&local_d08);
    Value::push_back(pmVar3,&local_ce8);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_ce8);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_d08);
    local_d10.instruction_set = local_934;
    local_d10.opcode = 0xf;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_d10);
    anon_unknown_0::FoldFTranscendentalUnary(&local_d50,tan);
    anon_unknown_0::FoldFPUnaryOp(&local_d30,&local_d50);
    Value::push_back(pmVar3,&local_d30);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_d30);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_d50);
    local_d58.instruction_set = local_934;
    local_d58.opcode = 0x10;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_d58);
    anon_unknown_0::FoldFTranscendentalUnary(&local_d98,asin);
    anon_unknown_0::FoldFPUnaryOp(&local_d78,&local_d98);
    Value::push_back(pmVar3,&local_d78);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_d78);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_d98);
    local_da0.instruction_set = local_934;
    local_da0.opcode = 0x11;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_da0);
    anon_unknown_0::FoldFTranscendentalUnary(&local_de0,acos);
    anon_unknown_0::FoldFPUnaryOp(&local_dc0,&local_de0);
    Value::push_back(pmVar3,&local_dc0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_dc0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_de0);
    local_de8.instruction_set = local_934;
    local_de8.opcode = 0x12;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_de8);
    anon_unknown_0::FoldFTranscendentalUnary(&local_e28,atan);
    anon_unknown_0::FoldFPUnaryOp(&local_e08,&local_e28);
    Value::push_back(pmVar3,&local_e08);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_e08);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_e28);
    local_e30.instruction_set = local_934;
    local_e30.opcode = 0x1b;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_e30);
    anon_unknown_0::FoldFTranscendentalUnary(&local_e70,exp);
    anon_unknown_0::FoldFPUnaryOp(&local_e50,&local_e70);
    Value::push_back(pmVar3,&local_e50);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_e50);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_e70);
    local_e78.instruction_set = local_934;
    local_e78.opcode = 0x1c;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_e78);
    anon_unknown_0::FoldFTranscendentalUnary(&local_eb8,log);
    anon_unknown_0::FoldFPUnaryOp(&local_e98,&local_eb8);
    Value::push_back(pmVar3,&local_e98);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_e98);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_eb8);
    local_ec0.instruction_set = local_934;
    local_ec0.opcode = 0x1d;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_ec0);
    anon_unknown_0::FoldFTranscendentalUnary(&local_f00,exp2);
    anon_unknown_0::FoldFPUnaryOp(&local_ee0,&local_f00);
    Value::push_back(pmVar3,&local_ee0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_ee0);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_f00);
    local_f08.instruction_set = local_934;
    local_f08.opcode = 0x1e;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_f08);
    anon_unknown_0::FoldFTranscendentalUnary(&local_f48,log2);
    anon_unknown_0::FoldFPUnaryOp(&local_f28,&local_f48);
    Value::push_back(pmVar3,&local_f28);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_f28);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_f48);
    local_f50.instruction_set = local_934;
    local_f50.opcode = 0x1f;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_f50);
    anon_unknown_0::FoldFTranscendentalUnary(&local_f90,sqrt);
    anon_unknown_0::FoldFPUnaryOp(&local_f70,&local_f90);
    Value::push_back(pmVar3,&local_f70);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_f70);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_f90);
    local_f98.instruction_set = local_934;
    local_f98.opcode = 0x19;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_f98);
    anon_unknown_0::FoldFTranscendentalBinary(&local_fd8,atan2);
    anon_unknown_0::FoldFPBinaryOp(&local_fb8,&local_fd8);
    Value::push_back(pmVar3,&local_fb8);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_fb8);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_fd8);
    local_fe0.instruction_set = local_934;
    local_fe0.opcode = 0x1a;
    pmVar3 = std::
             map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
             ::operator[](&this->ext_rules_,&local_fe0);
    anon_unknown_0::FoldFTranscendentalBinary(&local_1020,pow);
    anon_unknown_0::FoldFPBinaryOp(&local_1000,&local_1020);
    Value::push_back(pmVar3,&local_1000);
    std::
    function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
    ::~function(&local_1000);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_1020);
  }
  return;
}

Assistant:

void ConstantFoldingRules::AddFoldingRules() {
  // Add all folding rules to the list for the opcodes to which they apply.
  // Note that the order in which rules are added to the list matters. If a rule
  // applies to the instruction, the rest of the rules will not be attempted.
  // Take that into consideration.

  rules_[spv::Op::OpCompositeConstruct].push_back(FoldCompositeWithConstants());

  rules_[spv::Op::OpCompositeExtract].push_back(FoldExtractWithConstants());
  rules_[spv::Op::OpCompositeInsert].push_back(FoldInsertWithConstants());

  rules_[spv::Op::OpConvertFToS].push_back(FoldFToI());
  rules_[spv::Op::OpConvertFToU].push_back(FoldFToI());
  rules_[spv::Op::OpConvertSToF].push_back(FoldIToF());
  rules_[spv::Op::OpConvertUToF].push_back(FoldIToF());
  rules_[spv::Op::OpSConvert].push_back(FoldUnaryOp(FoldScalarSConvert));
  rules_[spv::Op::OpUConvert].push_back(FoldUnaryOp(FoldScalarUConvert));

  rules_[spv::Op::OpDot].push_back(FoldOpDotWithConstants());
  rules_[spv::Op::OpFAdd].push_back(FoldFAdd());
  rules_[spv::Op::OpFDiv].push_back(FoldFDiv());
  rules_[spv::Op::OpFMul].push_back(FoldFMul());
  rules_[spv::Op::OpFSub].push_back(FoldFSub());

  rules_[spv::Op::OpFOrdEqual].push_back(FoldFOrdEqual());

  rules_[spv::Op::OpFUnordEqual].push_back(FoldFUnordEqual());

  rules_[spv::Op::OpFOrdNotEqual].push_back(FoldFOrdNotEqual());

  rules_[spv::Op::OpFUnordNotEqual].push_back(FoldFUnordNotEqual());

  rules_[spv::Op::OpFOrdLessThan].push_back(FoldFOrdLessThan());
  rules_[spv::Op::OpFOrdLessThan].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFOrdLessThan));

  rules_[spv::Op::OpFUnordLessThan].push_back(FoldFUnordLessThan());
  rules_[spv::Op::OpFUnordLessThan].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFUnordLessThan));

  rules_[spv::Op::OpFOrdGreaterThan].push_back(FoldFOrdGreaterThan());
  rules_[spv::Op::OpFOrdGreaterThan].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFOrdGreaterThan));

  rules_[spv::Op::OpFUnordGreaterThan].push_back(FoldFUnordGreaterThan());
  rules_[spv::Op::OpFUnordGreaterThan].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFUnordGreaterThan));

  rules_[spv::Op::OpFOrdLessThanEqual].push_back(FoldFOrdLessThanEqual());
  rules_[spv::Op::OpFOrdLessThanEqual].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFOrdLessThanEqual));

  rules_[spv::Op::OpFUnordLessThanEqual].push_back(FoldFUnordLessThanEqual());
  rules_[spv::Op::OpFUnordLessThanEqual].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFUnordLessThanEqual));

  rules_[spv::Op::OpFOrdGreaterThanEqual].push_back(FoldFOrdGreaterThanEqual());
  rules_[spv::Op::OpFOrdGreaterThanEqual].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFOrdGreaterThanEqual));

  rules_[spv::Op::OpFUnordGreaterThanEqual].push_back(
      FoldFUnordGreaterThanEqual());
  rules_[spv::Op::OpFUnordGreaterThanEqual].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFUnordGreaterThanEqual));

  rules_[spv::Op::OpVectorShuffle].push_back(FoldVectorShuffleWithConstants());
  rules_[spv::Op::OpVectorTimesScalar].push_back(FoldVectorTimesScalar());
  rules_[spv::Op::OpVectorTimesMatrix].push_back(FoldVectorTimesMatrix());
  rules_[spv::Op::OpMatrixTimesVector].push_back(FoldMatrixTimesVector());
  rules_[spv::Op::OpTranspose].push_back(FoldTranspose);

  rules_[spv::Op::OpFNegate].push_back(FoldFNegate());
  rules_[spv::Op::OpSNegate].push_back(FoldSNegate());
  rules_[spv::Op::OpQuantizeToF16].push_back(FoldQuantizeToF16());

  rules_[spv::Op::OpIAdd].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return a + b; })));
  rules_[spv::Op::OpISub].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return a - b; })));
  rules_[spv::Op::OpIMul].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return a * b; })));
  rules_[spv::Op::OpUDiv].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return (b != 0 ? a / b : 0); })));
  rules_[spv::Op::OpSDiv].push_back(FoldBinaryOp(
      FoldBinaryIntegerOperation<Signed>([](uint64_t a, uint64_t b) {
        return (b != 0 ? static_cast<uint64_t>(static_cast<int64_t>(a) /
                                               static_cast<int64_t>(b))
                       : 0);
      })));
  rules_[spv::Op::OpUMod].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return (b != 0 ? a % b : 0); })));

  rules_[spv::Op::OpSRem].push_back(FoldBinaryOp(
      FoldBinaryIntegerOperation<Signed>([](uint64_t a, uint64_t b) {
        return (b != 0 ? static_cast<uint64_t>(static_cast<int64_t>(a) %
                                               static_cast<int64_t>(b))
                       : 0);
      })));

  rules_[spv::Op::OpSMod].push_back(FoldBinaryOp(
      FoldBinaryIntegerOperation<Signed>([](uint64_t a, uint64_t b) {
        if (b == 0) return static_cast<uint64_t>(0ull);

        int64_t signed_a = static_cast<int64_t>(a);
        int64_t signed_b = static_cast<int64_t>(b);
        int64_t result = signed_a % signed_b;
        if ((signed_b < 0) != (result < 0)) result += signed_b;
        return static_cast<uint64_t>(result);
      })));

  // Add rules for GLSLstd450
  FeatureManager* feature_manager = context_->get_feature_mgr();
  uint32_t ext_inst_glslstd450_id =
      feature_manager->GetExtInstImportId_GLSLstd450();
  if (ext_inst_glslstd450_id != 0) {
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FMix}].push_back(FoldFMix());
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SMin}].push_back(
        FoldFPBinaryOp(FoldMin));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UMin}].push_back(
        FoldFPBinaryOp(FoldMin));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FMin}].push_back(
        FoldFPBinaryOp(FoldMin));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SMax}].push_back(
        FoldFPBinaryOp(FoldMax));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UMax}].push_back(
        FoldFPBinaryOp(FoldMax));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FMax}].push_back(
        FoldFPBinaryOp(FoldMax));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UClamp}].push_back(
        FoldClamp1);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UClamp}].push_back(
        FoldClamp2);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UClamp}].push_back(
        FoldClamp3);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SClamp}].push_back(
        FoldClamp1);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SClamp}].push_back(
        FoldClamp2);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SClamp}].push_back(
        FoldClamp3);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FClamp}].push_back(
        FoldClamp1);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FClamp}].push_back(
        FoldClamp2);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FClamp}].push_back(
        FoldClamp3);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Sin}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::sin)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Cos}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::cos)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Tan}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::tan)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Asin}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::asin)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Acos}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::acos)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Atan}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::atan)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Exp}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::exp)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Log}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::log)));

#ifdef __ANDROID__
    // Android NDK r15c targeting ABI 15 doesn't have full support for C++11
    // (no std::exp2/log2). ::exp2 is available from C99 but ::log2 isn't
    // available up until ABI 18 so we use a shim
    auto log2_shim = [](double v) -> double { return log(v) / log(2.0); };
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Exp2}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(::exp2)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Log2}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(log2_shim)));
#else
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Exp2}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::exp2)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Log2}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::log2)));
#endif

    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Sqrt}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::sqrt)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Atan2}].push_back(
        FoldFPBinaryOp(FoldFTranscendentalBinary(std::atan2)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Pow}].push_back(
        FoldFPBinaryOp(FoldFTranscendentalBinary(std::pow)));
  }
}